

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_structure_type_t val)

{
  undefined4 in_ESI;
  undefined4 in_register_0000003c;
  string *this;
  ze_structure_type_t val_local;
  string *str;
  
  this = (string *)CONCAT44(in_register_0000003c,val);
  std::__cxx11::string::string(this);
  switch(in_ESI) {
  case 1:
    std::__cxx11::string::operator=(this,"DRIVER_PROPERTIES");
    break;
  case 2:
    std::__cxx11::string::operator=(this,"DRIVER_IPC_PROPERTIES");
    break;
  case 3:
    std::__cxx11::string::operator=(this,"DEVICE_PROPERTIES");
    break;
  case 4:
    std::__cxx11::string::operator=(this,"DEVICE_COMPUTE_PROPERTIES");
    break;
  case 5:
    std::__cxx11::string::operator=(this,"DEVICE_MODULE_PROPERTIES");
    break;
  case 6:
    std::__cxx11::string::operator=(this,"COMMAND_QUEUE_GROUP_PROPERTIES");
    break;
  case 7:
    std::__cxx11::string::operator=(this,"DEVICE_MEMORY_PROPERTIES");
    break;
  case 8:
    std::__cxx11::string::operator=(this,"DEVICE_MEMORY_ACCESS_PROPERTIES");
    break;
  case 9:
    std::__cxx11::string::operator=(this,"DEVICE_CACHE_PROPERTIES");
    break;
  case 10:
    std::__cxx11::string::operator=(this,"DEVICE_IMAGE_PROPERTIES");
    break;
  case 0xb:
    std::__cxx11::string::operator=(this,"DEVICE_P2P_PROPERTIES");
    break;
  case 0xc:
    std::__cxx11::string::operator=(this,"DEVICE_EXTERNAL_MEMORY_PROPERTIES");
    break;
  case 0xd:
    std::__cxx11::string::operator=(this,"CONTEXT_DESC");
    break;
  case 0xe:
    std::__cxx11::string::operator=(this,"COMMAND_QUEUE_DESC");
    break;
  case 0xf:
    std::__cxx11::string::operator=(this,"COMMAND_LIST_DESC");
    break;
  case 0x10:
    std::__cxx11::string::operator=(this,"EVENT_POOL_DESC");
    break;
  case 0x11:
    std::__cxx11::string::operator=(this,"EVENT_DESC");
    break;
  case 0x12:
    std::__cxx11::string::operator=(this,"FENCE_DESC");
    break;
  case 0x13:
    std::__cxx11::string::operator=(this,"IMAGE_DESC");
    break;
  case 0x14:
    std::__cxx11::string::operator=(this,"IMAGE_PROPERTIES");
    break;
  case 0x15:
    std::__cxx11::string::operator=(this,"DEVICE_MEM_ALLOC_DESC");
    break;
  default:
    std::__cxx11::string::operator=(this,"?");
  }
  return this;
}

Assistant:

std::string to_string( const ze_structure_type_t val )
{
    std::string str;

    switch( val )
    {
    case ZE_STRUCTURE_TYPE_DRIVER_PROPERTIES:
        str = "DRIVER_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DRIVER_IPC_PROPERTIES:
        str = "DRIVER_IPC_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_PROPERTIES:
        str = "DEVICE_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_COMPUTE_PROPERTIES:
        str = "DEVICE_COMPUTE_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_MODULE_PROPERTIES:
        str = "DEVICE_MODULE_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_COMMAND_QUEUE_GROUP_PROPERTIES:
        str = "COMMAND_QUEUE_GROUP_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_MEMORY_PROPERTIES:
        str = "DEVICE_MEMORY_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_MEMORY_ACCESS_PROPERTIES:
        str = "DEVICE_MEMORY_ACCESS_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_CACHE_PROPERTIES:
        str = "DEVICE_CACHE_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_IMAGE_PROPERTIES:
        str = "DEVICE_IMAGE_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_P2P_PROPERTIES:
        str = "DEVICE_P2P_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_EXTERNAL_MEMORY_PROPERTIES:
        str = "DEVICE_EXTERNAL_MEMORY_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_CONTEXT_DESC:
        str = "CONTEXT_DESC";
        break;

    case ZE_STRUCTURE_TYPE_COMMAND_QUEUE_DESC:
        str = "COMMAND_QUEUE_DESC";
        break;

    case ZE_STRUCTURE_TYPE_COMMAND_LIST_DESC:
        str = "COMMAND_LIST_DESC";
        break;

    case ZE_STRUCTURE_TYPE_EVENT_POOL_DESC:
        str = "EVENT_POOL_DESC";
        break;

    case ZE_STRUCTURE_TYPE_EVENT_DESC:
        str = "EVENT_DESC";
        break;

    case ZE_STRUCTURE_TYPE_FENCE_DESC:
        str = "FENCE_DESC";
        break;

    case ZE_STRUCTURE_TYPE_IMAGE_DESC:
        str = "IMAGE_DESC";
        break;

    case ZE_STRUCTURE_TYPE_IMAGE_PROPERTIES:
        str = "IMAGE_PROPERTIES";
        break;

    case ZE_STRUCTURE_TYPE_DEVICE_MEM_ALLOC_DESC:
        str = "DEVICE_MEM_ALLOC_DESC";
        break;

    default:
        str = "?";
        break;
    };

    return str;
}